

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O0

ShaderCreateInfoWrapper * __thiscall
Diligent::ShaderCreateInfoWrapper::operator=
          (ShaderCreateInfoWrapper *this,ShaderCreateInfoWrapper *rhs)

{
  ShaderCreateInfo local_b0;
  ShaderCreateInfoWrapper *local_18;
  ShaderCreateInfoWrapper *rhs_local;
  ShaderCreateInfoWrapper *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  memcpy(this,rhs,0x98);
  RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory>::operator=
            (&this->m_SourceFactory,&local_18->m_SourceFactory);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
            (&this->m_pRawMemory,&local_18->m_pRawMemory);
  ShaderCreateInfo::ShaderCreateInfo(&local_b0);
  memcpy(local_18,&local_b0,0x98);
  return this;
}

Assistant:

ShaderCreateInfoWrapper& operator=(ShaderCreateInfoWrapper&& rhs) noexcept
    {
        m_CreateInfo    = rhs.m_CreateInfo;
        m_SourceFactory = std::move(rhs.m_SourceFactory);
        m_pRawMemory    = std::move(rhs.m_pRawMemory);

        rhs.m_CreateInfo = {};

        return *this;
    }